

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p_min,ImVec2 *p_max,ImVec2 *uv_min,
          ImVec2 *uv_max,ImU32 col)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  
  if (col < 0x1000000) {
    return;
  }
  if ((this->_CmdHeader).TextureId != user_texture_id) {
    PushTextureID(this,user_texture_id);
    PrimReserve(this,6,4);
    PrimRectUV(this,p_min,p_max,uv_min,uv_max,col);
    iVar1 = (this->_TextureIdStack).Size;
    iVar3 = iVar1 + -1;
    (this->_TextureIdStack).Size = iVar3;
    if (iVar3 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = (this->_TextureIdStack).Data[(long)iVar1 + -2];
    }
    (this->_CmdHeader).TextureId = pvVar2;
    _OnChangedTextureID(this);
    return;
  }
  PrimReserve(this,6,4);
  PrimRectUV(this,p_min,p_max,uv_min,uv_max,col);
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& p_min, const ImVec2& p_max, const ImVec2& uv_min, const ImVec2& uv_max, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = user_texture_id != _CmdHeader.TextureId;
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(p_min, p_max, uv_min, uv_max, col);

    if (push_texture_id)
        PopTextureID();
}